

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularSolverMatrix.h
# Opt level: O0

void Eigen::internal::triangular_solve_matrix<double,_long,_1,_1,_false,_0,_0>::run
               (long size,long otherSize,double *_tri,long triStride,double *_other,long otherStride
               ,level3_blocking<double,_double> *blocking)

{
  double *pdVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  long *plVar5;
  ulong size_00;
  ulong size_01;
  LhsScalar *pLVar6;
  RhsScalar *pRVar7;
  undefined1 *puVar8;
  ulong *puVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  double *pdVar13;
  undefined1 auStack_5a8 [8];
  double *local_5a0 [4];
  long local_580;
  long local_578;
  double *local_570;
  bool local_568;
  undefined7 uStack_567;
  double *local_560;
  long local_558;
  double *local_550;
  long local_548;
  double *local_540;
  double *local_538;
  ulong local_530;
  ulong local_528;
  double *local_520;
  double *local_518;
  double *local_510;
  double *local_508;
  double *local_500;
  LhsScalar *local_4f8;
  LhsScalar *local_4f0;
  blas_data_mapper<double,_long,_0,_0> local_4e8;
  const_blas_data_mapper<double,_long,_0> local_4d8;
  long local_4c8;
  long local_4c0;
  long actual_mc;
  long i2;
  long end;
  long start;
  double *local_498;
  const_blas_data_mapper<double,_long,_0> local_490;
  long local_480;
  long startTarget;
  double *local_470;
  long local_468;
  long blockBOffset;
  long startBlock;
  long lengthTarget;
  long i3;
  double *l;
  double *r;
  double b;
  long j;
  double a;
  long s;
  long rs;
  long i;
  long k;
  long local_3f8;
  long local_3f0;
  long actualPanelWidth;
  long k1;
  long local_3d8;
  long actual_cols;
  long j2;
  long local_3c0;
  long actual_kc;
  long k2;
  long local_3a8;
  ulong local_3a0;
  long subcols;
  ptrdiff_t l3;
  ptrdiff_t l2;
  ptrdiff_t l1;
  undefined1 local_378 [4];
  gemm_pack_rhs<double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_0,_false,_true>
  pack_rhs;
  gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,_0,_false,_false>
  pack_lhs;
  gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_4,_false,_false>
  gebp_kernel;
  conj_if<false> conj;
  aligned_stack_memory_handler<double> blockB_stack_memory_destructor;
  double *blockB;
  undefined1 local_348 [8];
  aligned_stack_memory_handler<double> blockA_stack_memory_destructor;
  double *blockA;
  size_t sizeB;
  size_t sizeA;
  long local_310;
  long mc;
  long kc;
  OtherMapper other;
  TriMapper tri;
  long cols;
  long otherStride_local;
  double *_other_local;
  long triStride_local;
  double *_tri_local;
  long otherSize_local;
  long size_local;
  ulong local_2a0;
  long local_298;
  double *local_290;
  long *local_288;
  long local_280;
  double local_278;
  long *local_270;
  long local_268;
  long local_260;
  long *local_258;
  long local_250;
  double *local_248;
  long *local_240;
  long local_238;
  double *local_230;
  long *local_228;
  undefined8 local_220;
  long local_218;
  long *local_210;
  undefined1 local_208 [16];
  double *local_1f8;
  double *local_1f0;
  undefined1 *local_1e8;
  long local_1e0;
  long local_1d8;
  long *local_1d0;
  undefined1 local_1c8 [16];
  double *local_1b8;
  long local_1b0;
  undefined1 *local_1a8;
  long local_1a0;
  long local_198;
  long *local_190;
  undefined1 local_188 [16];
  double *local_178;
  long local_170;
  undefined1 *local_168;
  long local_160;
  long local_158;
  long *local_150;
  long local_148;
  long local_140;
  long *local_138;
  undefined8 local_130;
  long local_128;
  long *local_120;
  double local_118;
  double local_110;
  long *local_108;
  double local_100;
  long local_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long *local_d8;
  undefined1 local_d0 [16];
  long local_c0;
  double *local_b8;
  undefined1 *local_b0;
  long local_a8;
  long local_a0;
  long *local_98;
  long local_90;
  double *local_88;
  undefined1 *local_80;
  long local_78;
  long local_70;
  long *local_68;
  undefined1 local_60 [16];
  long local_50;
  double *local_48;
  undefined1 *local_40;
  long local_38;
  long local_30;
  long *local_28;
  long local_20;
  double *local_18;
  undefined1 *local_10;
  
  puVar8 = auStack_5a8;
  local_288 = &other.m_stride;
  local_228 = &kc;
  cols = otherStride;
  otherStride_local = (long)_other;
  _other_local = (double *)triStride;
  triStride_local = (long)_tri;
  _tri_local = (double *)otherSize;
  otherSize_local = size;
  local_298 = triStride;
  local_290 = _tri;
  local_250 = triStride;
  local_248 = _tri;
  local_240 = local_288;
  local_238 = otherStride;
  local_230 = _other;
  kc = (long)_other;
  other.m_data = (double *)otherStride;
  other.m_stride = (long)_tri;
  mc = level3_blocking<double,_double>::kc(blocking);
  sizeA = level3_blocking<double,_double>::mc(blocking);
  plVar5 = std::min<long>(&otherSize_local,(long *)&sizeA);
  local_310 = *plVar5;
  size_00 = mc * local_310;
  size_01 = mc * otherSize;
  local_2a0 = size_00;
  if (0x1fffffffffffffff < size_00) {
    throw_std_bad_alloc();
  }
  pLVar6 = level3_blocking<double,_double>::blockA(blocking);
  if (pLVar6 == (LhsScalar *)0x0) {
    if (size_00 * 8 < 0x20001) {
      lVar10 = -(size_00 * 8 + 0x1e & 0xfffffffffffffff0);
      puVar8 = auStack_5a8 + lVar10;
      local_4f8 = (LhsScalar *)((long)local_5a0 + lVar10);
    }
    else {
      local_4f8 = (LhsScalar *)aligned_malloc(size_00 * 8);
    }
    local_4f0 = local_4f8;
  }
  else {
    local_4f0 = level3_blocking<double,_double>::blockA(blocking);
    puVar8 = auStack_5a8;
  }
  blockA_stack_memory_destructor._16_8_ = local_4f0;
  *(undefined8 *)(puVar8 + -8) = 0x231e8d;
  pLVar6 = level3_blocking<double,_double>::blockA(blocking);
  if (pLVar6 == (LhsScalar *)0x0) {
    local_500 = (double *)blockA_stack_memory_destructor._16_8_;
  }
  else {
    local_500 = (double *)0x0;
  }
  pdVar1 = local_500;
  *(undefined8 *)(puVar8 + -8) = 0x231ee2;
  aligned_stack_memory_handler<double>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_348,pdVar1,size_00,0x20000 < size_00 * 8)
  ;
  size_local = size_01;
  if (0x1fffffffffffffff < size_01) {
    *(undefined8 *)(puVar8 + -8) = 0x231f08;
    throw_std_bad_alloc();
  }
  *(undefined8 *)(puVar8 + -8) = 0x231f17;
  pRVar7 = level3_blocking<double,_double>::blockB(blocking);
  if (pRVar7 == (RhsScalar *)0x0) {
    if (size_01 * 8 < 0x20001) {
      puVar8 = puVar8 + -(size_01 * 8 + 0x1e & 0xfffffffffffffff0);
      local_510 = (double *)((ulong)(puVar8 + 0xf) & 0xfffffffffffffff0);
    }
    else {
      *(undefined8 *)(puVar8 + -8) = 0x231f83;
      local_518 = (double *)aligned_malloc(size_01 * 8);
      local_510 = local_518;
    }
    local_508 = local_510;
  }
  else {
    *(undefined8 *)(puVar8 + -8) = 0x231f26;
    local_508 = level3_blocking<double,_double>::blockB(blocking);
  }
  pdVar1 = local_508;
  *(undefined8 *)(puVar8 + -8) = 0x231fc1;
  pRVar7 = level3_blocking<double,_double>::blockB(blocking);
  if (pRVar7 == (RhsScalar *)0x0) {
    local_520 = pdVar1;
  }
  else {
    local_520 = (double *)0x0;
  }
  pdVar13 = local_520;
  *(undefined8 *)(puVar8 + -8) = 0x23200f;
  aligned_stack_memory_handler<double>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_378,pdVar13,size_01,0x20000 < size_01 * 8
            );
  *(undefined8 *)(puVar8 + -8) = 0x23202d;
  manage_caching_sizes(GetAction,&l2,&l3,&subcols);
  if (otherSize < 1) {
    local_528 = 0;
  }
  else {
    local_530 = l3;
    *(undefined8 *)(puVar8 + -8) = 0x23205a;
    plVar5 = std::max<long>(&cols,&otherSize_local);
    local_528 = local_530 / (ulong)(*plVar5 << 5);
  }
  local_3a0 = local_528;
  local_3a8 = (long)local_528 / 4 << 2;
  k2 = 4;
  *(undefined8 *)(puVar8 + -8) = 0x2320cc;
  puVar9 = (ulong *)std::max<long>(&local_3a8,&k2);
  local_3a0 = *puVar9;
  for (actual_kc = 0; actual_kc < otherSize_local; actual_kc = mc + actual_kc) {
    j2 = otherSize_local - actual_kc;
    *(undefined8 *)(puVar8 + -8) = 0x23211d;
    plVar5 = std::min<long>(&j2,&mc);
    local_3c0 = *plVar5;
    for (actual_cols = 0; actual_cols < otherSize; actual_cols = local_3a0 + actual_cols) {
      k1 = otherSize - actual_cols;
      *(undefined8 *)(puVar8 + -8) = 0x23216e;
      plVar5 = std::min<long>(&k1,(long *)&local_3a0);
      local_3d8 = *plVar5;
      for (actualPanelWidth = 0; actualPanelWidth < local_3c0;
          actualPanelWidth = actualPanelWidth + 4) {
        local_3f8 = local_3c0 - actualPanelWidth;
        k = 4;
        *(undefined8 *)(puVar8 + -8) = 0x2321ca;
        plVar5 = std::min<long>(&local_3f8,&k);
        local_3f0 = *plVar5;
        for (i = 0; lVar3 = local_3c0, lVar2 = local_3d8, lVar10 = local_3f0, i < local_3f0;
            i = i + 1) {
          rs = actual_kc + actualPanelWidth + i;
          s = (local_3f0 - i) + -1;
          a = (double)(rs + 1);
          local_258 = &other.m_stride;
          pdVar13 = (double *)(other.m_stride + (rs + rs * triStride) * 8);
          local_268 = rs;
          local_260 = rs;
          *(undefined8 *)(puVar8 + -8) = 0x232297;
          pdVar13 = conj_if<false>::operator()((conj_if<false> *)((long)&l1 + 7),pdVar13);
          j = (long)(1.0 / *pdVar13);
          for (b = (double)actual_cols; (long)b < actual_cols + local_3d8; b = (double)((long)b + 1)
              ) {
            local_f0 = &kc;
            local_f8 = rs;
            local_100 = b;
            lVar10 = rs + (long)b * (long)other.m_data;
            r = (double *)((double)j * *(double *)(kc + lVar10 * 8));
            *(double **)(kc + lVar10 * 8) = r;
            local_108 = &kc;
            local_110 = a;
            local_118 = b;
            l = (double *)(kc + ((long)a + (long)b * (long)other.m_data) * 8);
            local_270 = &other.m_stride;
            local_278 = a;
            local_280 = rs;
            i3 = other.m_stride + ((long)a + rs * triStride) * 8;
            for (lengthTarget = 0; lengthTarget < s; lengthTarget = lengthTarget + 1) {
              local_538 = r;
              pdVar13 = (double *)(i3 + lengthTarget * 8);
              *(undefined8 *)(puVar8 + -8) = 0x23243b;
              pdVar13 = conj_if<false>::operator()((conj_if<false> *)((long)&l1 + 7),pdVar13);
              l[lengthTarget] = -(double)local_538 * *pdVar13 + l[lengthTarget];
            }
          }
        }
        startBlock = (local_3c0 - actualPanelWidth) - local_3f0;
        blockBOffset = actual_kc + actualPanelWidth;
        local_468 = actualPanelWidth;
        lVar12 = local_3c0 * actual_cols;
        local_550 = pdVar1 + lVar12;
        local_190 = &kc;
        local_198 = blockBOffset;
        local_1a0 = actual_cols;
        local_150 = &kc;
        local_158 = blockBOffset;
        local_160 = actual_cols;
        local_170 = kc + (blockBOffset + actual_cols * (long)other.m_data) * 8;
        local_168 = local_188;
        local_178 = other.m_data;
        local_548 = local_170;
        local_540 = other.m_data;
        startTarget = local_170;
        local_470 = other.m_data;
        *(long *)(puVar8 + -0x10) = actualPanelWidth;
        *(undefined8 *)(puVar8 + -0x18) = 0x232695;
        gemm_pack_rhs<double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_0,_false,_true>
        ::operator()((gemm_pack_rhs<double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_0,_false,_true>
                      *)((long)&l1 + 4),pdVar1 + lVar12,
                     (blas_data_mapper<double,_long,_0,_0> *)&startTarget,lVar10,lVar2,lVar3,
                     *(long *)(puVar8 + -0x10));
        uVar4 = blockA_stack_memory_destructor._16_8_;
        lVar2 = local_3f0;
        lVar10 = startBlock;
        if (0 < startBlock) {
          local_480 = actual_kc + actualPanelWidth + local_3f0;
          local_568 = blockA_stack_memory_destructor.m_deallocate;
          uStack_567 = blockA_stack_memory_destructor._17_7_;
          local_68 = &other.m_stride;
          local_70 = local_480;
          local_78 = blockBOffset;
          local_28 = &other.m_stride;
          local_30 = local_480;
          local_38 = blockBOffset;
          local_48 = (double *)(other.m_stride + (local_480 + blockBOffset * triStride) * 8);
          local_40 = local_60;
          local_50 = triStride;
          local_10 = local_60;
          local_18 = local_48;
          local_20 = triStride;
          local_560 = local_48;
          local_558 = triStride;
          local_490.super_blas_data_mapper<const_double,_long,_0,_0>.m_data = local_48;
          local_490.super_blas_data_mapper<const_double,_long,_0,_0>.m_stride = triStride;
          *(undefined8 *)(puVar8 + -0x10) = 0;
          *(undefined8 *)(puVar8 + -0x18) = 0x2327dc;
          gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,_0,_false,_false>
          ::operator()((gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,_0,_false,_false>
                        *)((long)&l1 + 5),(double *)uVar4,&local_490,lVar2,lVar10,0,
                       *(long *)(puVar8 + -0x10));
          uVar4 = blockA_stack_memory_destructor._16_8_;
          lVar12 = local_3c0;
          lVar3 = local_3d8;
          lVar2 = local_3f0;
          lVar10 = startBlock;
          local_1d0 = &kc;
          local_1d8 = local_480;
          local_1e0 = actual_cols;
          local_138 = &kc;
          local_140 = local_480;
          local_148 = actual_cols;
          local_1b0 = kc + (local_480 + actual_cols * (long)other.m_data) * 8;
          local_1a8 = local_1c8;
          local_1b8 = other.m_data;
          local_578 = local_1b0;
          local_570 = other.m_data;
          start = local_1b0;
          local_498 = other.m_data;
          lVar11 = local_3c0 * actual_cols;
          *(long *)(puVar8 + -0x10) = local_468;
          *(long *)(puVar8 + -0x20) = lVar12;
          *(long *)(puVar8 + -0x28) = lVar2;
          *(long *)(puVar8 + -0x30) = lVar3;
          *(undefined8 *)(puVar8 + -0x18) = 0;
          *(undefined8 *)(puVar8 + -0x38) = 0x23294d;
          gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_4,_false,_false>
          ::operator()((gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_4,_false,_false>
                        *)((long)&l1 + 6),(blas_data_mapper<double,_long,_0,_0> *)&start,
                       (double *)uVar4,pdVar1 + lVar11,lVar10,lVar2,*(long *)(puVar8 + -0x30),-1.0,
                       *(long *)(puVar8 + -0x28),*(long *)(puVar8 + -0x20),*(long *)(puVar8 + -0x18)
                       ,*(long *)(puVar8 + -0x10));
        }
      }
    }
    i2 = otherSize_local;
    actual_mc = actual_kc + mc;
    end = actual_mc;
    for (; actual_mc < i2; actual_mc = local_310 + actual_mc) {
      local_4c8 = i2 - actual_mc;
      *(undefined8 *)(puVar8 + -8) = 0x2329f7;
      plVar5 = std::min<long>(&local_310,&local_4c8);
      uVar4 = blockA_stack_memory_destructor._16_8_;
      lVar2 = local_3c0;
      lVar10 = *plVar5;
      local_4c0 = lVar10;
      if (0 < lVar10) {
        local_5a0[2] = (double *)blockA_stack_memory_destructor._16_8_;
        local_d8 = &other.m_stride;
        local_e0 = actual_mc;
        local_e8 = actual_kc;
        local_98 = &other.m_stride;
        local_a0 = actual_mc;
        local_a8 = actual_kc;
        local_b8 = (double *)(other.m_stride + (actual_mc + actual_kc * triStride) * 8);
        local_b0 = local_d0;
        local_c0 = triStride;
        local_80 = local_d0;
        local_88 = local_b8;
        local_90 = triStride;
        local_5a0[3] = local_b8;
        local_580 = triStride;
        local_4d8.super_blas_data_mapper<const_double,_long,_0,_0>.m_data = local_b8;
        local_4d8.super_blas_data_mapper<const_double,_long,_0,_0>.m_stride = triStride;
        *(undefined8 *)(puVar8 + -0x10) = 0;
        *(undefined8 *)(puVar8 + -0x18) = 0x232b65;
        gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,_0,_false,_false>
        ::operator()((gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,_0,_false,_false>
                      *)((long)&l1 + 5),(double *)uVar4,&local_4d8,lVar2,lVar10,0,
                     *(long *)(puVar8 + -0x10));
        uVar4 = blockA_stack_memory_destructor._16_8_;
        lVar2 = local_3c0;
        lVar10 = local_4c0;
        local_210 = &kc;
        local_218 = actual_mc;
        local_220 = 0;
        local_120 = &kc;
        local_128 = actual_mc;
        local_130 = 0;
        local_1f0 = (double *)(kc + actual_mc * 8);
        local_1e8 = local_208;
        local_1f8 = other.m_data;
        local_5a0[0] = local_1f0;
        local_5a0[1] = other.m_data;
        local_4e8.m_data = local_1f0;
        local_4e8.m_stride = (long)other.m_data;
        *(long *)(puVar8 + -0x30) = otherSize;
        *(undefined8 *)(puVar8 + -0x10) = 0;
        *(undefined8 *)(puVar8 + -0x18) = 0;
        *(undefined8 *)(puVar8 + -0x20) = 0xffffffffffffffff;
        *(undefined8 *)(puVar8 + -0x28) = 0xffffffffffffffff;
        *(undefined8 *)(puVar8 + -0x38) = 0x232cbf;
        gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_4,_false,_false>
        ::operator()((gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_4,_false,_false>
                      *)((long)&l1 + 6),&local_4e8,(double *)uVar4,pdVar1,lVar10,lVar2,
                     *(long *)(puVar8 + -0x30),-1.0,*(long *)(puVar8 + -0x28),
                     *(long *)(puVar8 + -0x20),*(long *)(puVar8 + -0x18),*(long *)(puVar8 + -0x10));
      }
    }
  }
  *(undefined8 *)(puVar8 + -8) = 0x232d0b;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_378);
  *(undefined8 *)(puVar8 + -8) = 0x232d17;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_348);
  return;
}

Assistant:

EIGEN_DONT_INLINE void triangular_solve_matrix<Scalar,Index,OnTheLeft,Mode,Conjugate,TriStorageOrder,ColMajor>::run(
    Index size, Index otherSize,
    const Scalar* _tri, Index triStride,
    Scalar* _other, Index otherStride,
    level3_blocking<Scalar,Scalar>& blocking)
  {
    Index cols = otherSize;

    typedef const_blas_data_mapper<Scalar, Index, TriStorageOrder> TriMapper;
    typedef blas_data_mapper<Scalar, Index, ColMajor> OtherMapper;
    TriMapper tri(_tri, triStride);
    OtherMapper other(_other, otherStride);

    typedef gebp_traits<Scalar,Scalar> Traits;

    enum {
      SmallPanelWidth   = EIGEN_PLAIN_ENUM_MAX(Traits::mr,Traits::nr),
      IsLower = (Mode&Lower) == Lower
    };

    Index kc = blocking.kc();                   // cache block size along the K direction
    Index mc = (std::min)(size,blocking.mc());  // cache block size along the M direction

    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*cols;

    ei_declare_aligned_stack_constructed_variable(Scalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockB, sizeB, blocking.blockB());

    conj_if<Conjugate> conj;
    gebp_kernel<Scalar, Scalar, Index, OtherMapper, Traits::mr, Traits::nr, Conjugate, false> gebp_kernel;
    gemm_pack_lhs<Scalar, Index, TriMapper, Traits::mr, Traits::LhsProgress, TriStorageOrder> pack_lhs;
    gemm_pack_rhs<Scalar, Index, OtherMapper, Traits::nr, ColMajor, false, true> pack_rhs;

    // the goal here is to subdivise the Rhs panels such that we keep some cache
    // coherence when accessing the rhs elements
    std::ptrdiff_t l1, l2, l3;
    manage_caching_sizes(GetAction, &l1, &l2, &l3);
    Index subcols = cols>0 ? l2/(4 * sizeof(Scalar) * std::max<Index>(otherStride,size)) : 0;
    subcols = std::max<Index>((subcols/Traits::nr)*Traits::nr, Traits::nr);

    for(Index k2=IsLower ? 0 : size;
        IsLower ? k2<size : k2>0;
        IsLower ? k2+=kc : k2-=kc)
    {
      const Index actual_kc = (std::min)(IsLower ? size-k2 : k2, kc);

      // We have selected and packed a big horizontal panel R1 of rhs. Let B be the packed copy of this panel,
      // and R2 the remaining part of rhs. The corresponding vertical panel of lhs is split into
      // A11 (the triangular part) and A21 the remaining rectangular part.
      // Then the high level algorithm is:
      //  - B = R1                    => general block copy (done during the next step)
      //  - R1 = A11^-1 B             => tricky part
      //  - update B from the new R1  => actually this has to be performed continuously during the above step
      //  - R2 -= A21 * B             => GEPP

      // The tricky part: compute R1 = A11^-1 B while updating B from R1
      // The idea is to split A11 into multiple small vertical panels.
      // Each panel can be split into a small triangular part T1k which is processed without optimization,
      // and the remaining small part T2k which is processed using gebp with appropriate block strides
      for(Index j2=0; j2<cols; j2+=subcols)
      {
        Index actual_cols = (std::min)(cols-j2,subcols);
        // for each small vertical panels [T1k^T, T2k^T]^T of lhs
        for (Index k1=0; k1<actual_kc; k1+=SmallPanelWidth)
        {
          Index actualPanelWidth = std::min<Index>(actual_kc-k1, SmallPanelWidth);
          // tr solve
          for (Index k=0; k<actualPanelWidth; ++k)
          {
            // TODO write a small kernel handling this (can be shared with trsv)
            Index i  = IsLower ? k2+k1+k : k2-k1-k-1;
            Index rs = actualPanelWidth - k - 1; // remaining size
            Index s  = TriStorageOrder==RowMajor ? (IsLower ? k2+k1 : i+1)
                                                 :  IsLower ? i+1 : i-rs;

            Scalar a = (Mode & UnitDiag) ? Scalar(1) : Scalar(1)/conj(tri(i,i));
            for (Index j=j2; j<j2+actual_cols; ++j)
            {
              if (TriStorageOrder==RowMajor)
              {
                Scalar b(0);
                const Scalar* l = &tri(i,s);
                Scalar* r = &other(s,j);
                for (Index i3=0; i3<k; ++i3)
                  b += conj(l[i3]) * r[i3];

                other(i,j) = (other(i,j) - b)*a;
              }
              else
              {
                Scalar b = (other(i,j) *= a);
                Scalar* r = &other(s,j);
                const Scalar* l = &tri(s,i);
                for (Index i3=0;i3<rs;++i3)
                  r[i3] -= b * conj(l[i3]);
              }
            }
          }

          Index lengthTarget = actual_kc-k1-actualPanelWidth;
          Index startBlock   = IsLower ? k2+k1 : k2-k1-actualPanelWidth;
          Index blockBOffset = IsLower ? k1 : lengthTarget;

          // update the respective rows of B from other
          pack_rhs(blockB+actual_kc*j2, other.getSubMapper(startBlock,j2), actualPanelWidth, actual_cols, actual_kc, blockBOffset);

          // GEBP
          if (lengthTarget>0)
          {
            Index startTarget  = IsLower ? k2+k1+actualPanelWidth : k2-actual_kc;

            pack_lhs(blockA, tri.getSubMapper(startTarget,startBlock), actualPanelWidth, lengthTarget);

            gebp_kernel(other.getSubMapper(startTarget,j2), blockA, blockB+actual_kc*j2, lengthTarget, actualPanelWidth, actual_cols, Scalar(-1),
                        actualPanelWidth, actual_kc, 0, blockBOffset);
          }
        }
      }
      
      // R2 -= A21 * B => GEPP
      {
        Index start = IsLower ? k2+kc : 0;
        Index end   = IsLower ? size : k2-kc;
        for(Index i2=start; i2<end; i2+=mc)
        {
          const Index actual_mc = (std::min)(mc,end-i2);
          if (actual_mc>0)
          {
            pack_lhs(blockA, tri.getSubMapper(i2, IsLower ? k2 : k2-kc), actual_kc, actual_mc);

            gebp_kernel(other.getSubMapper(i2, 0), blockA, blockB, actual_mc, actual_kc, cols, Scalar(-1), -1, -1, 0, 0);
          }
        }
      }
    }
  }